

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dj_algebra.h
# Opt level: O1

mat4 * dja::mat4::homogeneous::rotation(mat4 *__return_storage_ptr__,quaternion *q)

{
  undefined8 local_34;
  float_t local_2c;
  undefined8 local_28;
  float_t local_20;
  undefined8 local_1c;
  float_t local_14;
  
  mat3::rotation(q);
  __return_storage_ptr__->m[0].x = 0.0;
  __return_storage_ptr__->m[0].y = 0.0;
  __return_storage_ptr__->m[0].z = 0.0;
  __return_storage_ptr__->m[0].w = 0.0;
  __return_storage_ptr__->m[1].x = 0.0;
  __return_storage_ptr__->m[1].y = 0.0;
  __return_storage_ptr__->m[1].z = 0.0;
  __return_storage_ptr__->m[1].w = 0.0;
  __return_storage_ptr__->m[2].x = 0.0;
  __return_storage_ptr__->m[2].y = 0.0;
  __return_storage_ptr__->m[2].z = 0.0;
  __return_storage_ptr__->m[2].w = 0.0;
  __return_storage_ptr__->m[3].x = 0.0;
  __return_storage_ptr__->m[3].y = 0.0;
  __return_storage_ptr__->m[3].z = 0.0;
  __return_storage_ptr__->m[3].w = 0.0;
  __return_storage_ptr__->m[0].x = (float_t)(undefined4)local_34;
  __return_storage_ptr__->m[0].y = (float_t)local_34._4_4_;
  __return_storage_ptr__->m[0].z = local_2c;
  __return_storage_ptr__->m[0].w = 0.0;
  __return_storage_ptr__->m[1].x = (float_t)(undefined4)local_28;
  __return_storage_ptr__->m[1].y = (float_t)local_28._4_4_;
  __return_storage_ptr__->m[1].z = local_20;
  __return_storage_ptr__->m[1].w = 0.0;
  __return_storage_ptr__->m[2].x = (float_t)(undefined4)local_1c;
  __return_storage_ptr__->m[2].y = (float_t)local_1c._4_4_;
  __return_storage_ptr__->m[2].z = local_14;
  *(undefined8 *)&__return_storage_ptr__->m[2].w = 0;
  __return_storage_ptr__->m[3].y = 0.0;
  __return_storage_ptr__->m[3].z = 0.0;
  __return_storage_ptr__->m[3].w = 1.0;
  return __return_storage_ptr__;
}

Assistant:

mat4 mat4::homogeneous::rotation(const quaternion& q)
{
    return mat4::homogeneous::from_mat3(mat3::rotation(q));
}